

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     call_assignment_no_alias<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,1,true>,Eigen::internal::swap_assign_op<float>>
               (Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true> *dst,
               Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true> *src,
               swap_assign_op<float> *func)

{
  ActualDstType actualDst;
  swap_assign_op<float> *func_local;
  Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true> *src_local;
  Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,_1,_true> *dst_local;
  
  Assignment<Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_1,_true>,_Eigen::internal::swap_assign_op<float>,_Eigen::internal::Dense2Dense,_void>
  ::run(dst,src,func);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE
void call_assignment_no_alias(Dst& dst, const Src& src, const Func& func)
{
  enum {
    NeedToTranspose = (    (int(Dst::RowsAtCompileTime) == 1 && int(Src::ColsAtCompileTime) == 1)
                        || (int(Dst::ColsAtCompileTime) == 1 && int(Src::RowsAtCompileTime) == 1)
                      ) && int(Dst::SizeAtCompileTime) != 1
  };

  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst>::type ActualDstTypeCleaned;
  typedef typename internal::conditional<NeedToTranspose, Transpose<Dst>, Dst&>::type ActualDstType;
  ActualDstType actualDst(dst);

  // TODO check whether this is the right place to perform these checks:
  EIGEN_STATIC_ASSERT_LVALUE(Dst)
  EIGEN_STATIC_ASSERT_SAME_MATRIX_SIZE(ActualDstTypeCleaned,Src)
  EIGEN_CHECK_BINARY_COMPATIBILIY(Func,typename ActualDstTypeCleaned::Scalar,typename Src::Scalar);

  Assignment<ActualDstTypeCleaned,Src,Func>::run(actualDst, src, func);
}